

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11_init.c
# Opt level: O0

GLFWbool hasUsableInputMethodStyle(void)

{
  char *pcVar1;
  uint local_1c;
  ushort *puStack_18;
  uint i;
  XIMStyles *styles;
  GLFWbool found;
  
  styles._0_4_ = 0;
  puStack_18 = (ushort *)0x0;
  pcVar1 = (*_glfw.x11.xlib.GetIMValues)(_glfw.x11.im,"queryInputStyle",&stack0xffffffffffffffe8,0);
  if (pcVar1 == (char *)0x0) {
    for (local_1c = 0; local_1c < *puStack_18; local_1c = local_1c + 1) {
      if (*(long *)(*(long *)(puStack_18 + 4) + (ulong)local_1c * 8) == 0x408) {
        styles._0_4_ = 1;
        break;
      }
    }
    (*_glfw.x11.xlib.Free)(puStack_18);
    styles._4_4_ = (GLFWbool)styles;
  }
  else {
    styles._4_4_ = 0;
  }
  return styles._4_4_;
}

Assistant:

static GLFWbool hasUsableInputMethodStyle(void)
{
    GLFWbool found = GLFW_FALSE;
    XIMStyles* styles = NULL;

    if (XGetIMValues(_glfw.x11.im, XNQueryInputStyle, &styles, NULL) != NULL)
        return GLFW_FALSE;

    for (unsigned int i = 0;  i < styles->count_styles;  i++)
    {
        if (styles->supported_styles[i] == (XIMPreeditNothing | XIMStatusNothing))
        {
            found = GLFW_TRUE;
            break;
        }
    }

    XFree(styles);
    return found;
}